

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::iterate(ShaderFloatPrecisionCase *this)

{
  ostringstream *this_00;
  ostream *stream;
  float fVar1;
  code *pcVar2;
  deRandom *rnd;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  Float<unsigned_int,_8,_23,_127,_3U> FVar6;
  uint uVar7;
  undefined4 extraout_var;
  float *__s;
  IterateResult IVar9;
  long lVar10;
  ulong uVar11;
  ostringstream *poVar12;
  float *pfVar13;
  float fVar14;
  float __tmp;
  deUint64 u64;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  deUint16 indices [6];
  float in1Arr [4];
  float in0Arr [4];
  float position [16];
  Hex<8UL> local_448;
  long local_440;
  long local_438 [2];
  undefined1 local_428 [16];
  double local_418;
  double local_410;
  double local_408;
  ulong local_400;
  TestLog *local_3f8;
  deUint32 local_3ec;
  undefined1 local_3e8 [16];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_3d8;
  long local_3c0;
  ShaderFloatPrecisionCase *local_3b8;
  deRandom *local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [16];
  undefined8 *local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  int local_350;
  VertexArrayPointer local_348 [2];
  ios_base local_300 [264];
  undefined1 local_1f8 [16];
  long local_1e8;
  long local_1e0 [2];
  int local_1d0;
  ios_base local_180 [264];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar8;
  
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f80000000000000;
  local_58 = 0xbf8000003f800000;
  uStack_50 = 0x3f80000000000000;
  local_68 = 0x3f800000bf800000;
  uStack_60 = 0x3f80000000000000;
  local_78 = 0xbf800000bf800000;
  uStack_70 = 0x3f80000000000000;
  local_3a8 = 0x2000200010000;
  local_3a0 = 0x30001;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3f8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  local_3d8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_3d8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (float *)operator_new(0x4000);
  memset(__s,0,0x4000);
  local_3ec = (this->m_program->m_program).m_program;
  (**(code **)(lVar8 + 0x1680))();
  (**(code **)(lVar8 + 0x78))(0x8d40,this->m_framebuffer);
  local_448.value = (deUint64)local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"a_position","");
  local_1f8._0_4_ = 1;
  local_1f8._8_8_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1f8 + 8),local_448.value,local_440 + local_448.value);
  local_1d0 = 0;
  local_378._0_4_ = local_1f8._0_4_;
  local_378._8_8_ = &local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_378 + 8),local_1f8._8_8_,local_1e8 + local_1f8._8_8_);
  local_350 = local_1d0;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 4;
  local_348[0].numElements = 4;
  local_348[0].stride = 0;
  local_348[0].data = &local_78;
  if ((long *)local_1f8._8_8_ != local_1e0) {
    operator_delete((void *)local_1f8._8_8_,local_1e0[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_3d8,(VertexArrayBinding *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._8_8_ != &local_360) {
    operator_delete((void *)local_378._8_8_,local_360._M_allocated_capacity + 1);
  }
  if ((long *)local_448.value != local_438) {
    operator_delete((void *)local_448.value,local_438[0] + 1);
  }
  local_448.value = (deUint64)local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"a_in0","");
  local_1f8._0_4_ = 1;
  local_1f8._8_8_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1f8 + 8),local_448.value,local_440 + local_448.value);
  local_1d0 = 0;
  local_378._0_4_ = local_1f8._0_4_;
  local_378._8_8_ = &local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_378 + 8),local_1f8._8_8_,local_1e8 + local_1f8._8_8_);
  local_350 = local_1d0;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 1;
  local_348[0].numElements = 4;
  local_348[0].stride = 0;
  local_348[0].data = &local_388;
  if ((long *)local_1f8._8_8_ != local_1e0) {
    operator_delete((void *)local_1f8._8_8_,local_1e0[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_3d8,(VertexArrayBinding *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._8_8_ != &local_360) {
    operator_delete((void *)local_378._8_8_,local_360._M_allocated_capacity + 1);
  }
  if ((long *)local_448.value != local_438) {
    operator_delete((void *)local_448.value,local_438[0] + 1);
  }
  local_448.value = (deUint64)local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"a_in1","");
  local_1f8._0_4_ = 1;
  local_1f8._8_8_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1f8 + 8),local_448.value,local_440 + local_448.value);
  local_1d0 = 0;
  local_378._0_4_ = local_1f8._0_4_;
  local_378._8_8_ = &local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_378 + 8),local_1f8._8_8_,local_1e8 + local_1f8._8_8_);
  local_350 = local_1d0;
  local_348[0].componentType = VTX_COMP_FLOAT;
  local_348[0].convert = VTX_COMP_CONVERT_NONE;
  local_348[0].numComponents = 1;
  local_348[0].numElements = 4;
  local_348[0].stride = 0;
  local_348[0].data = &local_398;
  if ((long *)local_1f8._8_8_ != local_1e0) {
    operator_delete((void *)local_1f8._8_8_,local_1e0[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_3d8,(VertexArrayBinding *)local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._8_8_ != &local_360) {
    operator_delete((void *)local_378._8_8_,local_360._M_allocated_capacity + 1);
  }
  if ((long *)local_448.value != local_438) {
    operator_delete((void *)local_448.value,local_438[0] + 1);
  }
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x168);
  if (0 < this->m_numTestsPerIter) {
    local_3b0 = &(this->m_rnd).m_rnd;
    this_00 = (ostringstream *)(local_378 + 8);
    local_400 = 0;
    local_3c0 = lVar8;
    local_3b8 = this;
    do {
      rnd = local_3b0;
      poVar12 = (ostringstream *)(local_1f8 + 8);
      local_408 = (double)CONCAT44(local_408._4_4_,(this->m_rangeA).m_data[0]);
      local_428 = ZEXT416((uint)(this->m_rangeA).m_data[1]);
      fVar14 = deRandom_getFloat(local_3b0);
      local_410 = (double)CONCAT44(local_410._4_4_,fVar14);
      local_418 = (double)CONCAT44(local_418._4_4_,(this->m_rangeB).m_data[0]);
      local_3e8 = ZEXT416((uint)(this->m_rangeB).m_data[1]);
      fVar14 = deRandom_getFloat(rnd);
      local_428._0_4_ =
           ((float)local_428._0_4_ - local_408._0_4_) * local_410._0_4_ + local_408._0_4_;
      local_3e8._0_4_ = ((float)local_3e8._0_4_ - local_418._0_4_) * fVar14 + local_418._0_4_;
      local_408 = (double)(float)local_428._0_4_;
      local_410 = (double)(float)local_3e8._0_4_;
      local_418 = (*this->m_evalFunc)(local_408,local_410);
      local_378._0_8_ = local_418;
      FVar6 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                        ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_378);
      local_1f8._0_8_ = local_3f8;
      std::__cxx11::ostringstream::ostringstream(poVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"iter ",5);
      std::ostream::operator<<(poVar12,this->m_iterNdx);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,", test ",7);
      std::ostream::operator<<(poVar12,(int)local_400);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"in0 = ",6);
      std::ostream::_M_insert<double>(local_408);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," / ",3);
      local_448.value = (deUint64)(uint)local_428._0_4_;
      tcu::Format::Hex<8UL>::toStream(&local_448,(ostream *)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,", in1 = ",8);
      std::ostream::_M_insert<double>(local_410);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," / ",3);
      local_448.value = (deUint64)(uint)local_3e8._0_4_;
      tcu::Format::Hex<8UL>::toStream(&local_448,(ostream *)poVar12);
      local_378._0_8_ =
           tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_378 + 8));
      stream = (ostream *)(local_378 + 8);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"  reference = ",0xe);
      std::ostream::_M_insert<double>((double)(float)FVar6.m_value);
      std::__ostream_insert<char,std::char_traits<char>>(stream," / ",3);
      local_448.value = (deUint64)FVar6.m_value;
      tcu::Format::Hex<8UL>::toStream(&local_448,stream);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_378 + 8));
      std::ios_base::~ios_base(local_300);
      std::__cxx11::ostringstream::~ostringstream(poVar12);
      std::ios_base::~ios_base(local_180);
      local_388 = CONCAT44(local_428._0_4_,local_428._0_4_);
      uStack_380 = CONCAT44(local_428._0_4_,local_428._0_4_);
      local_398 = CONCAT44(local_3e8._0_4_,local_3e8._0_4_);
      uStack_390 = CONCAT44(local_3e8._0_4_,local_3e8._0_4_);
      local_378._0_8_ = 0x600000000;
      local_378._8_4_ = 1;
      local_368 = &local_3a8;
      glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_3ec,
                (int)((ulong)((long)local_3d8.
                                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3d8.
                                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
                local_3d8.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_378,
                (DrawUtilCallback *)0x0);
      (**(code **)(lVar8 + 0x1220))(0,0,0x20,0x20,0x8d99,0x1405,__s);
      dVar5 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar5,"After render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                      ,0x17e);
      local_378._0_8_ = local_3f8;
      poVar12 = (ostringstream *)(local_378 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"  result = ",0xb);
      std::ostream::_M_insert<double>((double)*__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," / ",3);
      local_1f8._0_8_ = ZEXT48((uint)*__s);
      tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_1f8,(ostream *)poVar12);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_378 + 8));
      std::ios_base::~ios_base(local_300);
      bVar3 = compare(this,(float)local_428._0_4_,(float)local_3e8._0_4_,local_418,*__s);
      if (bVar3) {
        fVar14 = *__s;
        bVar3 = true;
        uVar11 = 0;
        pfVar13 = __s;
        do {
          local_428._0_8_ = pfVar13;
          lVar10 = 0;
          do {
            fVar1 = *pfVar13;
            if (fVar1 != fVar14) {
              local_378._0_8_ = local_3f8;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"ERROR: Inconsistent results, got ",0x21);
              local_1f8._0_8_ = (TestLog *)(ulong)(uint)fVar1;
              tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_1f8,(ostream *)this_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," at (",5);
              std::ostream::operator<<(this_00,(int)lVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
              std::ostream::operator<<(this_00,(int)uVar11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_300);
              bVar3 = false;
            }
            this = local_3b8;
            lVar8 = local_3c0;
            lVar10 = lVar10 + 1;
            pfVar13 = pfVar13 + 4;
          } while (lVar10 != 0x20);
          if (0x1e < uVar11) break;
          uVar11 = uVar11 + 1;
          pfVar13 = (float *)(local_428._0_8_ + 0x200);
        } while (bVar3);
        if (!bVar3) {
          tcu::TestContext::setTestResult
                    ((local_3b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Inconsistent values in framebuffer");
        }
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Result comparison failed");
      }
    } while ((((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
              QP_TEST_RESULT_PASS) &&
            (uVar7 = (int)local_400 + 1, local_400 = (ulong)uVar7,
            (int)uVar7 < this->m_numTestsPerIter));
  }
  pcVar2 = *(code **)(lVar8 + 0x78);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar2)(0x8d40,iVar4);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"After iteration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x1a9);
  iVar4 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar4;
  IVar9 = STOP;
  if (iVar4 < this->m_numIters) {
    IVar9 = (IterateResult)
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
            QP_TEST_RESULT_PASS);
  }
  operator_delete(__s,0x4000);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&local_3d8);
  return IVar9;
}

Assistant:

ShaderFloatPrecisionCase::IterateResult ShaderFloatPrecisionCase::iterate (void)
{
	// Constant data.
	const float position[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};
	const deUint16					indices[]	= { 0, 1, 2, 2, 1, 3 };

	const int						numVertices	= 4;
	float							in0Arr[4]	= { 0.0f };
	float							in1Arr[4]	= { 0.0f };

	TestLog&						log			= m_testCtx.getLog();
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	vector<glu::VertexArrayBinding>	vertexArrays;

	// Image read from GL.
	std::vector<float>	pixels		(FRAMEBUFFER_WIDTH*FRAMEBUFFER_HEIGHT*4);

	// \todo [2012-05-03 pyry] Could be cached.
	deUint32			prog		= m_program->getProgram();

	gl.useProgram(prog);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	vertexArrays.push_back(glu::va::Float("a_position", 4, numVertices, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float("a_in0", 1, numVertices, 0, &in0Arr[0]));
	vertexArrays.push_back(glu::va::Float("a_in1", 1, numVertices, 0, &in1Arr[0]));

	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	// Compute values and reference.
	for (int testNdx = 0; testNdx < m_numTestsPerIter; testNdx++)
	{
		const float		in0		= m_rnd.getFloat(m_rangeA.x(), m_rangeA.y());
		const float		in1		= m_rnd.getFloat(m_rangeB.x(), m_rangeB.y());
		const double	refD	= m_evalFunc((double)in0, (double)in1);
		const float		refF	= tcu::Float64(refD).asFloat(); // Uses RTE rounding mode.

		log << TestLog::Message << "iter " << m_iterNdx << ", test " << testNdx << ": "
								<< "in0 = " << in0 << " / " << tcu::toHex(tcu::Float32(in0).bits())
								<< ", in1 = " << in1 << " / " << tcu::toHex(tcu::Float32(in1).bits())
			<< TestLog::EndMessage
			<< TestLog::Message << "  reference = " << refF << " / " << tcu::toHex(tcu::Float32(refF).bits()) << TestLog::EndMessage;

		std::fill(&in0Arr[0], &in0Arr[0] + DE_LENGTH_OF_ARRAY(in0Arr), in0);
		std::fill(&in1Arr[0], &in1Arr[0] + DE_LENGTH_OF_ARRAY(in1Arr), in1);

		glu::draw(m_context.getRenderContext(), prog, (int)vertexArrays.size(), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		gl.readPixels(0, 0, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "After render");

		log << TestLog::Message << "  result = " << pixels[0] << " / " << tcu::toHex(tcu::Float32(pixels[0]).bits()) << TestLog::EndMessage;

		// Verify results
		{
			const bool firstPixelOk = compare(in0, in1, refD, pixels[0]);

			if (firstPixelOk)
			{
				// Check that rest of pixels match to first one.
				const deUint32	firstPixelBits	= tcu::Float32(pixels[0]).bits();
				bool			allPixelsOk		= true;

				for (int y = 0; y < FRAMEBUFFER_HEIGHT; y++)
				{
					for (int x = 0; x < FRAMEBUFFER_WIDTH; x++)
					{
						const deUint32 pixelBits = tcu::Float32(pixels[(y*FRAMEBUFFER_WIDTH + x)*4]).bits();

						if (pixelBits != firstPixelBits)
						{
							log << TestLog::Message << "ERROR: Inconsistent results, got " << tcu::toHex(pixelBits) << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
							allPixelsOk = false;
						}
					}

					if (!allPixelsOk)
						break;
				}

				if (!allPixelsOk)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsistent values in framebuffer");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");
		}

		if (m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			break;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	GLU_EXPECT_NO_ERROR(gl.getError(), "After iteration");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}